

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

int __thiscall
CVmObjStringBuffer::getp_delete
          (CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_obj_id_t self_00;
  vm_strbuf_ext *pvVar2;
  uint *in_RCX;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  CVmObjStringBuffer *in_RDI;
  int32_t len;
  int32_t idx;
  uint argc;
  undefined4 in_stack_ffffffffffffffa8;
  int32_t iVar3;
  uint uVar4;
  uint uVar5;
  int32_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc4;
  
  if (in_RCX == (uint *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = *in_RCX;
  }
  uVar5 = uVar4;
  if ((getp_delete(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_delete(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_delete::desc,1,2);
    __cxa_guard_release(&getp_delete(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (uint *)in_RDI,(CVmNativeCodeDesc *)CONCAT44(uVar5,in_stack_ffffffffffffffa8));
  if (iVar1 == 0) {
    iVar1 = CVmBif::pop_int_val();
    if (iVar1 < 0) {
      pvVar2 = get_ext(in_RDI);
      iVar3 = pvVar2->len;
    }
    else {
      iVar3 = -1;
    }
    iVar1 = iVar3 + iVar1;
    if (uVar4 < 2) {
      pvVar2 = get_ext(in_RDI);
      self_00 = pvVar2->len;
    }
    else {
      self_00 = CVmBif::pop_int_val();
    }
    delete_text((CVmObjStringBuffer *)CONCAT44(in_stack_ffffffffffffffc4,iVar1),self_00,
                in_stack_ffffffffffffffb8,(int32_t)((ulong)in_RDI >> 0x20),(int)in_RDI);
    vm_val_t::set_obj(in_RDX,in_ESI);
  }
  return 1;
}

Assistant:

int CVmObjStringBuffer::getp_delete(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1, 2);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* pop the deletion index and adjust to 0-based or end-based */
    int32_t idx = CVmBif::pop_int_val(vmg0_);
    idx += (idx < 0 ? get_ext()->len : -1);

    /* pop the length, if provided; if not, delete the rest of the string */
    int32_t len;
    if (argc >= 2)
        len = CVmBif::pop_int_val(vmg0_);
    else
        len = get_ext()->len;

    /* do the delete */
    delete_text(vmg_ self, idx, len, TRUE);

    /* handled */
    retval->set_obj(self);
    return TRUE;
}